

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O2

subset_iterator<std::_List_iterator<int>,_std::less<void>,_std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>_>
* __thiscall
burst::make_subset_iterator<std::__cxx11::list<int,std::allocator<int>>&>
          (subset_iterator<std::_List_iterator<int>,_std::less<void>,_std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>_>
           *__return_storage_ptr__,burst *this,list<int,_std::allocator<int>_> *range)

{
  subset_iterator<std::_List_iterator<int>,_std::less<void>,_std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>_>
  ::subset_iterator(__return_storage_ptr__,*(undefined8 *)this,this);
  return __return_storage_ptr__;
}

Assistant:

auto make_subset_iterator (ForwardRange && range)
    {
        using std::begin;
        using std::end;
        return
            make_subset_iterator
            (
                begin(std::forward<ForwardRange>(range)),
                end(std::forward<ForwardRange>(range))
            );
    }